

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
embree::avx::HeuristicArraySpatialSAH<embree::avx::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
::sequential_object_split
          (HeuristicArraySpatialSAH<embree::avx::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
           *this,ObjectSplit *split,PrimInfoExtRange *set,PrimInfoExtRange *lset,
          PrimInfoExtRange *rset)

{
  undefined1 auVar1 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  PrimRef *pPVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  unsigned_long uVar20;
  unsigned_long uVar21;
  PrimRef *pPVar22;
  PrimRef *pPVar23;
  PrimRef *pPVar24;
  unsigned_long uVar25;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar26;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar27;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar28;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar29;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  pair<unsigned_long,_unsigned_long> pVar41;
  
  uVar5 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  uVar6 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  auVar1._0_4_ = split->field_2;
  auVar1._4_4_ = split->data;
  auVar1._8_8_ = (split->mapping).num;
  auVar8 = vpshufd_avx(auVar1,0);
  auVar1 = *(undefined1 (*) [16])(mm_lookupmask_ps + (1L << ((byte)split->dim & 0x3f)) * 0x10);
  pPVar7 = this->prims0;
  pPVar24 = pPVar7 + uVar5;
  aVar27.m128[2] = INFINITY;
  aVar27._0_8_ = 0x7f8000007f800000;
  aVar27.m128[3] = INFINITY;
  aVar26.m128[2] = -INFINITY;
  aVar26._0_8_ = 0xff800000ff800000;
  aVar26.m128[3] = -INFINITY;
  uVar21 = 0;
  uVar20 = 0;
  pPVar22 = pPVar7 + uVar6;
  aVar28 = aVar26;
  aVar29 = aVar27;
  aVar30 = aVar27;
  aVar31 = aVar26;
  aVar32 = aVar27;
  aVar33 = aVar26;
  do {
    pPVar23 = pPVar22 + -1;
    if (pPVar24 <= pPVar23) {
      do {
        aVar2 = (pPVar24->lower).field_0.field_1;
        aVar3 = (pPVar24->upper).field_0.field_1;
        auVar36._0_4_ = aVar2.x + aVar3.x;
        auVar36._4_4_ = aVar2.y + aVar3.y;
        auVar36._8_4_ = aVar2.z + aVar3.z;
        auVar36._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
        auVar34 = vsubps_avx(auVar36,(undefined1  [16])(split->mapping).ofs.field_0);
        auVar38._0_4_ = auVar34._0_4_ * (split->mapping).scale.field_0.v[0];
        auVar38._4_4_ = auVar34._4_4_ * (split->mapping).scale.field_0.v[1];
        auVar38._8_4_ = auVar34._8_4_ * (split->mapping).scale.field_0.v[2];
        auVar38._12_4_ = auVar34._12_4_ * (split->mapping).scale.field_0.v[3];
        auVar34 = vroundps_avx(auVar38,1);
        auVar34 = vcvtps2dq_avx(auVar34);
        auVar34 = vpcmpgtd_avx(auVar8,auVar34);
        auVar34 = auVar1 & auVar34;
        if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar34[0xf]
           ) break;
        aVar30.m128 = (__m128)vminps_avx(aVar30.m128,(undefined1  [16])aVar2);
        aVar31.m128 = (__m128)vmaxps_avx(aVar31.m128,(undefined1  [16])aVar3);
        aVar32.m128 = (__m128)vminps_avx(aVar32.m128,auVar36);
        aVar33.m128 = (__m128)vmaxps_avx(aVar33.m128,auVar36);
        uVar20 = uVar20 + ((uint)(pPVar24->lower).field_0.m128[3] >> 0x1b);
        pPVar24 = pPVar24 + 1;
      } while (pPVar24 <= pPVar23);
    }
    if (pPVar23 < pPVar24) {
LAB_002f0264:
      uVar25 = (long)pPVar24 - (long)pPVar7 >> 5;
      (lset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar30;
      (lset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar31;
      (lset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar32;
      (lset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar33;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar5;
      (lset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar25;
      (lset->super_extended_range<unsigned_long>)._ext_end = uVar25;
      (rset->super_CentGeomBBox3fa).geomBounds.lower.field_0 = aVar29;
      (rset->super_CentGeomBBox3fa).geomBounds.upper.field_0 = aVar28;
      (rset->super_CentGeomBBox3fa).centBounds.lower.field_0 = aVar27;
      (rset->super_CentGeomBBox3fa).centBounds.upper.field_0 = aVar26;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin = uVar25;
      (rset->super_extended_range<unsigned_long>).super_range<unsigned_long>._end = uVar6;
      (rset->super_extended_range<unsigned_long>)._ext_end = uVar6;
      pVar41.second = uVar21;
      pVar41.first = uVar20;
      return pVar41;
    }
    aVar4 = (split->mapping).ofs.field_0;
    fVar9 = (split->mapping).scale.field_0.v[0];
    fVar10 = (split->mapping).scale.field_0.v[1];
    fVar11 = (split->mapping).scale.field_0.v[2];
    fVar12 = (split->mapping).scale.field_0.v[3];
    aVar2 = pPVar22[-1].lower.field_0.field_1;
    aVar3 = pPVar22[-1].upper.field_0.field_1;
    auVar37._0_4_ = aVar2.x + aVar3.x;
    auVar37._4_4_ = aVar2.y + aVar3.y;
    auVar37._8_4_ = aVar2.z + aVar3.z;
    auVar37._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
    auVar34 = vsubps_avx(auVar37,(undefined1  [16])aVar4);
    auVar39._0_4_ = auVar34._0_4_ * fVar9;
    auVar39._4_4_ = auVar34._4_4_ * fVar10;
    auVar39._8_4_ = auVar34._8_4_ * fVar11;
    auVar39._12_4_ = auVar34._12_4_ * fVar12;
    auVar34 = vroundps_avx(auVar39,1);
    auVar34 = vcvtps2dq_avx(auVar34);
    auVar34 = vpcmpgtd_avx(auVar8,auVar34);
    auVar34 = auVar1 & auVar34;
    if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar34[0xf]) {
      pPVar22 = pPVar22 + -2;
      do {
        pPVar23 = pPVar22;
        aVar28.m128 = (__m128)vmaxps_avx(aVar28.m128,(undefined1  [16])aVar3);
        aVar29.m128 = (__m128)vminps_avx(aVar29.m128,(undefined1  [16])aVar2);
        uVar21 = ((uint)pPVar23[1].lower.field_0.m128[3] >> 0x1b) + uVar21;
        aVar27.m128 = (__m128)vminps_avx(aVar27.m128,auVar37);
        aVar26.m128 = (__m128)vmaxps_avx(aVar26.m128,auVar37);
        if (pPVar23 < pPVar24) goto LAB_002f0264;
        aVar2 = (pPVar23->lower).field_0.field_1;
        aVar3 = (pPVar23->upper).field_0.field_1;
        auVar37._0_4_ = aVar2.x + aVar3.x;
        auVar37._4_4_ = aVar2.y + aVar3.y;
        auVar37._8_4_ = aVar2.z + aVar3.z;
        auVar37._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
        auVar34 = vsubps_avx(auVar37,(undefined1  [16])aVar4);
        auVar40._0_4_ = auVar34._0_4_ * fVar9;
        auVar40._4_4_ = auVar34._4_4_ * fVar10;
        auVar40._8_4_ = auVar34._8_4_ * fVar11;
        auVar40._12_4_ = auVar34._12_4_ * fVar12;
        auVar34 = vroundps_avx(auVar40,1);
        auVar34 = vcvtps2dq_avx(auVar34);
        auVar34 = vpcmpgtd_avx(auVar8,auVar34);
        auVar34 = auVar1 & auVar34;
        pPVar22 = pPVar23 + -1;
      } while ((((auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               -1 < auVar34[0xf]);
    }
    if (pPVar23 < pPVar24) goto LAB_002f0264;
    aVar2 = (pPVar23->lower).field_0.field_1;
    aVar3 = (pPVar23->upper).field_0.field_1;
    aVar30.m128 = (__m128)vminps_avx(aVar30.m128,(undefined1  [16])aVar2);
    aVar31.m128 = (__m128)vmaxps_avx(aVar31.m128,(undefined1  [16])aVar3);
    auVar34._0_4_ = aVar2.x + aVar3.x;
    auVar34._4_4_ = aVar2.y + aVar3.y;
    auVar34._8_4_ = aVar2.z + aVar3.z;
    auVar34._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
    aVar32.m128 = (__m128)vminps_avx(aVar32.m128,auVar34);
    aVar33.m128 = (__m128)vmaxps_avx(aVar33.m128,auVar34);
    uVar20 = uVar20 + ((uint)(pPVar23->lower).field_0.m128[3] >> 0x1b);
    aVar2 = (pPVar24->lower).field_0.field_1;
    aVar3 = (pPVar24->upper).field_0.field_1;
    aVar29.m128 = (__m128)vminps_avx(aVar29.m128,(undefined1  [16])aVar2);
    aVar28.m128 = (__m128)vmaxps_avx(aVar28.m128,(undefined1  [16])aVar3);
    auVar35._0_4_ = aVar2.x + aVar3.x;
    auVar35._4_4_ = aVar2.y + aVar3.y;
    auVar35._8_4_ = aVar2.z + aVar3.z;
    auVar35._12_4_ = aVar2.field_3.w + aVar3.field_3.w;
    aVar27.m128 = (__m128)vminps_avx(aVar27.m128,auVar35);
    aVar26.m128 = (__m128)vmaxps_avx(aVar26.m128,auVar35);
    uVar21 = uVar21 + ((uint)(pPVar24->lower).field_0.m128[3] >> 0x1b);
    uVar13 = *(undefined8 *)&(pPVar24->lower).field_0;
    uVar14 = *(undefined8 *)((long)&(pPVar24->lower).field_0 + 8);
    uVar15 = *(undefined8 *)&(pPVar24->upper).field_0;
    uVar16 = *(undefined8 *)((long)&(pPVar24->upper).field_0 + 8);
    uVar17 = *(undefined8 *)((long)&(pPVar23->lower).field_0 + 8);
    uVar18 = *(undefined8 *)&(pPVar23->upper).field_0;
    uVar19 = *(undefined8 *)((long)&(pPVar23->upper).field_0 + 8);
    *(undefined8 *)&(pPVar24->lower).field_0 = *(undefined8 *)&(pPVar23->lower).field_0;
    *(undefined8 *)((long)&(pPVar24->lower).field_0 + 8) = uVar17;
    *(undefined8 *)&(pPVar24->upper).field_0 = uVar18;
    *(undefined8 *)((long)&(pPVar24->upper).field_0 + 8) = uVar19;
    *(undefined8 *)&(pPVar23->lower).field_0 = uVar13;
    *(undefined8 *)((long)&(pPVar23->lower).field_0 + 8) = uVar14;
    *(undefined8 *)&(pPVar23->upper).field_0 = uVar15;
    *(undefined8 *)((long)&(pPVar23->upper).field_0 + 8) = uVar16;
    pPVar24 = pPVar24 + 1;
    pPVar22 = pPVar23;
  } while( true );
}

Assistant:

std::pair<size_t,size_t> sequential_object_split(const ObjectSplit& split, const PrimInfoExtRange& set, PrimInfoExtRange& lset, PrimInfoExtRange& rset) 
        {
          const size_t begin = set.begin();
          const size_t end   = set.end();
          PrimInfo local_left(empty);
          PrimInfo local_right(empty);
          const unsigned int splitPos = split.pos;
          const unsigned int splitDim = split.dim;
          const unsigned int splitDimMask = (unsigned int)1 << splitDim; 

          const typename ObjectBinner::vint vSplitPos(splitPos);
          const typename ObjectBinner::vbool vSplitMask(splitDimMask);
          size_t center = serial_partitioning(prims0,
                                              begin,end,local_left,local_right,
                                              [&] (const PrimRef& ref) { 
                                                return split.mapping.bin_unsafe(ref,vSplitPos,vSplitMask);
                                              },
                                              [] (PrimInfo& pinfo,const PrimRef& ref) { pinfo.add_center2(ref,ref.lower.u >> (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)); });          
          const size_t left_weight  = local_left.end;
          const size_t right_weight = local_right.end;

          new (&lset) PrimInfoExtRange(begin,center,center,local_left);
          new (&rset) PrimInfoExtRange(center,end,end,local_right);

          assert(!lset.geomBounds.empty() && area(lset.geomBounds) >= 0.0f);
          assert(!rset.geomBounds.empty() && area(rset.geomBounds) >= 0.0f);
          return std::pair<size_t,size_t>(left_weight,right_weight);
        }